

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void __thiscall FGUIDCVar::SetGenericRepDefault(FGUIDCVar *this,UCVarValue value,ECVarType type)

{
  uint32 *puVar1;
  undefined8 uVar2;
  WORD WVar3;
  WORD WVar4;
  GUID *pGVar5;
  
  pGVar5 = FBaseCVar::ToGUID(value,type);
  if (pGVar5 != (GUID *)0x0) {
    WVar3 = pGVar5->Data2;
    WVar4 = pGVar5->Data3;
    uVar2 = *(undefined8 *)pGVar5->Data4;
    (this->Value).Data1 = pGVar5->Data1;
    (this->Value).Data2 = WVar3;
    (this->Value).Data3 = WVar4;
    *(undefined8 *)(this->Value).Data4 = uVar2;
    if (((this->super_FBaseCVar).Flags & 0x80) != 0) {
      FBaseCVar::SetGenericRep(&this->super_FBaseCVar,value,type);
      puVar1 = &(this->super_FBaseCVar).Flags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    }
  }
  return;
}

Assistant:

void FGUIDCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	const GUID *guid = ToGUID (value, type);
	if (guid != NULL)
	{
		Value = *guid;
		if (Flags & CVAR_ISDEFAULT)
		{
			SetGenericRep (value, type);
			Flags |= CVAR_ISDEFAULT;
		}
	}
}